

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

bool cfd::TransactionContextUtil::IsOpTrueLockingScript(UtxoData *utxo,AbstractTxIn *txin)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ScriptOperator *this;
  CfdException *pCVar4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> locking_script_items;
  Script local_70;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_38;
  
  core::Script::GetElementList(&local_38,&utxo->locking_script);
  if ((long)local_38.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_38.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x60) {
    this = core::ScriptElement::GetOpCode
                     (local_38.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = core::ScriptOperator::operator==(this,(ScriptOperator *)core::ScriptOperator::OP_TRUE);
    if (bVar1) {
      uVar3 = core::AbstractTxIn::GetScriptWitnessStackNum(txin);
      if (uVar3 != 0) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_70._vptr_Script =
             (_func_int **)
             ((long)&local_70.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Exist witness stack. OP_TRUE is unused.","");
        core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_70);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::AbstractTxIn::GetUnlockingScript(&local_70,txin);
      bVar2 = core::Script::IsEmpty(&local_70);
      core::Script::~Script(&local_70);
      bVar1 = true;
      if (!bVar2) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_70._vptr_Script =
             (_func_int **)
             ((long)&local_70.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Exist scriptsig. OP_TRUE is unused.","");
        core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_70);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      goto LAB_00472aab;
    }
  }
  bVar1 = false;
LAB_00472aab:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_38);
  return bVar1;
}

Assistant:

bool TransactionContextUtil::IsOpTrueLockingScript(
    const UtxoData& utxo, const AbstractTxIn* txin) {
  std::vector<ScriptElement> locking_script_items =
      utxo.locking_script.GetElementList();
  if (locking_script_items.size() == 1) {
    if (locking_script_items[0].GetOpCode() == ScriptOperator::OP_TRUE) {
      if (txin->GetScriptWitnessStackNum() != 0) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist witness stack. OP_TRUE is unused.");
      }
      if (!txin->GetUnlockingScript().IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist scriptsig. OP_TRUE is unused.");
      }
      return true;  // OP_TRUE only.
    }
  }
  return false;
}